

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_LS.h
# Opt level: O1

ssize_t __thiscall
fanuc_post_processor::generate_LS::write(generate_LS *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  ofstream output_file;
  long local_210;
  filebuf local_208 [24];
  byte abStack_1f0 [216];
  ios_base local_118 [264];
  
  std::ofstream::ofstream(&local_210);
  std::ofstream::open((char *)&local_210,0x106267);
  if ((abStack_1f0[*(long *)(local_210 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cannot open file !!!",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,(this->program)._M_dataplus._M_p,(this->program)._M_string_length
            );
  std::ofstream::close();
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_208);
  sVar1 = std::ios_base::~ios_base(local_118);
  return sVar1;
}

Assistant:

void generate_LS::write() {
        std::ofstream output_file;
        output_file.open("/home/sizen/CLionProjects/generate_LS/pos.ls");
        if(output_file.fail()) std::cout<<"cannot open file !!!"<<std::endl;
        output_file<<program;
        output_file.close();

    }